

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

void __thiscall CTcDataStream::write_obj_id(CTcDataStream *this,ulong obj_id)

{
  long in_RSI;
  CTcDataStream *in_RDI;
  CTcDataStream *unaff_retaddr;
  
  if ((G_keep_objfixups != 0) && (in_RSI != 0)) {
    get_ofs(in_RDI);
    CTcIdFixup::add_fixup
              ((CTcIdFixup **)this,(CTcDataStream *)obj_id,(ulong)unaff_retaddr,(ulong)in_RDI);
  }
  write4(unaff_retaddr,(ulong)in_RDI);
  return;
}

Assistant:

void CTcDataStream::write_obj_id(ulong obj_id)
{
    /* 
     *   if there's an object ID fixup list, and this is a valid object
     *   reference (not a 'nil' reference), add this reference 
     */
    if (G_keep_objfixups && obj_id != TCTARG_INVALID_OBJ)
        CTcIdFixup::add_fixup(&G_objfixup, this, get_ofs(), obj_id);

    /* write the ID */
    write4(obj_id);
}